

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O0

int check_posture(CHAR_DATA *ch)

{
  int modifier;
  AFFECT_DATA *paf;
  CHAR_DATA *ch_local;
  
  paf = ch->affected;
  while( true ) {
    if (paf == (AFFECT_DATA *)0x0) {
      return 0;
    }
    if (paf->type == gsn_posture) break;
    paf = paf->next;
  }
  return (int)paf->modifier;
}

Assistant:

int check_posture(CHAR_DATA *ch)
{
	AFFECT_DATA *paf;
	int modifier = POSTURE_NONE;

	for (paf = ch->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->type == gsn_posture)
		{
			modifier = paf->modifier;
			break;
		}
	}

	return modifier;
}